

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

char * __thiscall kj::Path::basename(Path *this,char *__filename)

{
  size_t sVar1;
  String *pSVar2;
  Array<kj::String> local_68;
  undefined1 local_50 [8];
  ArrayBuilder<kj::String> newParts;
  Fault local_20;
  Fault f;
  Path *this_local;
  
  f.exception = (Exception *)__filename;
  sVar1 = Array<kj::String>::size((Array<kj::String> *)__filename);
  if (sVar1 != 0) {
    heapArrayBuilder<kj::String>((ArrayBuilder<kj::String> *)local_50,1);
    sVar1 = Array<kj::String>::size((Array<kj::String> *)__filename);
    pSVar2 = Array<kj::String>::operator[]((Array<kj::String> *)__filename,sVar1 - 1);
    pSVar2 = mv<kj::String>(pSVar2);
    ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)local_50,pSVar2);
    ArrayBuilder<kj::String>::finish(&local_68,(ArrayBuilder<kj::String> *)local_50);
    Path(this,&local_68,ALREADY_CHECKED);
    Array<kj::String>::~Array(&local_68);
    ArrayBuilder<kj::String>::~ArrayBuilder((ArrayBuilder<kj::String> *)local_50);
    return (char *)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x74,FAILED,"parts.size() > 0","\"root path has no basename\"",
             (char (*) [26])"root path has no basename");
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

Path Path::basename() && {
  KJ_REQUIRE(parts.size() > 0, "root path has no basename");
  auto newParts = kj::heapArrayBuilder<String>(1);
  newParts.add(kj::mv(parts[parts.size() - 1]));
  return Path(newParts.finish(), ALREADY_CHECKED);
}